

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O0

void __thiscall FusionEKF::~FusionEKF(FusionEKF *this)

{
  FusionEKF *this_local;
  
  this->_vptr_FusionEKF = (_func_int **)&PTR__FusionEKF_00143cf0;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&this->Hj_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&this->H_laser_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&this->R_radar_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&this->R_laser_);
  Tools::~Tools(&this->tools);
  KalmanFilter::~KalmanFilter(&this->ekf_);
  return;
}

Assistant:

FusionEKF::~FusionEKF() {}